

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall
efsw::DirectorySnapshot::moveFile(DirectorySnapshot *this,string *oldPath,string *newPath)

{
  string local_70 [48];
  string local_40 [32];
  string *local_20;
  string *newPath_local;
  string *oldPath_local;
  DirectorySnapshot *this_local;
  
  local_20 = newPath;
  newPath_local = oldPath;
  oldPath_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)oldPath);
  removeFile(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_70,(string *)newPath);
  addFile(this,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void DirectorySnapshot::moveFile( std::string oldPath, std::string newPath ) {
	removeFile( oldPath );
	addFile( newPath );
}